

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O0

Mesh * vera::cubeCornersMesh(Mesh *__return_storage_ptr__,vec3 *_min_v,vec3 *_max_v,float _size)

{
  float fVar1;
  float fVar2;
  vec<3,_float,_(glm::qualifier)0> vVar3;
  vec<3,_float,_(glm::qualifier)0> local_1648;
  vec3 local_1638;
  Mesh local_1628;
  vec3 local_1580;
  vec<3,_float,_(glm::qualifier)0> local_1570;
  vec<3,_float,_(glm::qualifier)0> local_1560;
  vec3 local_1550;
  Mesh local_1540;
  vec3 local_1498;
  vec<3,_float,_(glm::qualifier)0> local_1488;
  vec<3,_float,_(glm::qualifier)0> local_1478;
  vec3 local_1468;
  Mesh local_1458;
  vec3 local_13b0;
  vec<3,_float,_(glm::qualifier)0> local_13a0;
  vec<3,_float,_(glm::qualifier)0> local_1390;
  vec3 local_1380;
  Mesh local_1370;
  vec3 local_12c8;
  vec<3,_float,_(glm::qualifier)0> local_12b8;
  vec<3,_float,_(glm::qualifier)0> local_12a8;
  vec3 local_1298;
  Mesh local_1288;
  vec3 local_11e0;
  vec<3,_float,_(glm::qualifier)0> local_11d0;
  vec<3,_float,_(glm::qualifier)0> local_11c0;
  vec3 local_11b0;
  Mesh local_11a0;
  vec3 local_10f8;
  vec<3,_float,_(glm::qualifier)0> local_10e8;
  vec<3,_float,_(glm::qualifier)0> local_10d8;
  vec3 local_10c8;
  Mesh local_10b8;
  vec3 local_1010;
  vec<3,_float,_(glm::qualifier)0> local_1000;
  vec<3,_float,_(glm::qualifier)0> local_ff0;
  vec3 local_fe0;
  Mesh local_fd0;
  vec3 local_f28;
  vec<3,_float,_(glm::qualifier)0> local_f18;
  vec<3,_float,_(glm::qualifier)0> local_f08;
  vec3 local_ef8;
  Mesh local_ee8;
  vec3 local_e40;
  vec<3,_float,_(glm::qualifier)0> local_e30;
  vec<3,_float,_(glm::qualifier)0> local_e20;
  vec3 local_e10;
  Mesh local_e00;
  vec3 local_d58;
  vec<3,_float,_(glm::qualifier)0> local_d48;
  vec<3,_float,_(glm::qualifier)0> local_d38;
  vec3 local_d28;
  Mesh local_d18;
  vec3 local_c70;
  vec<3,_float,_(glm::qualifier)0> local_c60;
  vec<3,_float,_(glm::qualifier)0> local_c50;
  vec3 local_c40;
  Mesh local_c30;
  vec3 local_b88;
  vec<3,_float,_(glm::qualifier)0> local_b78;
  vec<3,_float,_(glm::qualifier)0> local_b68;
  vec3 local_b58;
  Mesh local_b48;
  vec3 local_aa0;
  vec<3,_float,_(glm::qualifier)0> local_a90;
  vec<3,_float,_(glm::qualifier)0> local_a80;
  vec3 local_a70;
  Mesh local_a60;
  vec3 local_9b8;
  vec<3,_float,_(glm::qualifier)0> local_9a8;
  vec<3,_float,_(glm::qualifier)0> local_998;
  vec3 local_988;
  Mesh local_978;
  vec3 local_8d0;
  vec<3,_float,_(glm::qualifier)0> local_8c0;
  vec<3,_float,_(glm::qualifier)0> local_8b0;
  vec3 local_8a0;
  Mesh local_890;
  vec3 local_7e8;
  vec<3,_float,_(glm::qualifier)0> local_7d8;
  vec<3,_float,_(glm::qualifier)0> local_7c8;
  vec3 local_7b8;
  Mesh local_7a8;
  vec3 local_700;
  vec<3,_float,_(glm::qualifier)0> local_6f0;
  vec<3,_float,_(glm::qualifier)0> local_6e0;
  vec3 local_6d0;
  Mesh local_6c0;
  vec3 local_618;
  vec<3,_float,_(glm::qualifier)0> local_608;
  vec<3,_float,_(glm::qualifier)0> local_5f8;
  vec3 local_5e8;
  Mesh local_5d8;
  vec3 local_530;
  vec<3,_float,_(glm::qualifier)0> local_520;
  vec<3,_float,_(glm::qualifier)0> local_510;
  vec3 local_500;
  Mesh local_4f0;
  vec3 local_448;
  vec<3,_float,_(glm::qualifier)0> local_438;
  vec<3,_float,_(glm::qualifier)0> local_428;
  vec3 local_418;
  Mesh local_408;
  vec3 local_360;
  vec<3,_float,_(glm::qualifier)0> local_350;
  vec<3,_float,_(glm::qualifier)0> local_340;
  vec3 local_330;
  Mesh local_320;
  vec3 local_278;
  vec<3,_float,_(glm::qualifier)0> local_268;
  vec<3,_float,_(glm::qualifier)0> local_258;
  vec3 local_248;
  Mesh local_238;
  vec3 local_190;
  vec<3,_float,_(glm::qualifier)0> local_180;
  vec<3,_float,_(glm::qualifier)0> local_170;
  vec3 local_160;
  Mesh local_150;
  undefined1 local_91;
  undefined1 local_90 [8];
  vec3 I;
  vec3 G;
  vec3 F;
  vec3 D;
  vec3 C;
  vec3 B;
  vec3 H;
  float fStack_34;
  vec3 A;
  float size;
  float _size_local;
  vec3 *_max_v_local;
  vec3 *_min_v_local;
  Mesh *mesh;
  
  fVar1 = glm::length<3,float,(glm::qualifier)0>(_min_v);
  fVar2 = glm::length<3,float,(glm::qualifier)0>(_max_v);
  fVar1 = glm::min<float>(fVar1,fVar2);
  fVar2 = fVar1 * _size * 0.5;
  fVar1 = (_max_v->field_2).z;
  H.field_2 = *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)&_max_v->field_0;
  fStack_34 = *(float *)&_max_v->field_1;
  H.field_0 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)&_min_v->field_2;
  B.field_1 = *(anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 *)&_min_v->field_0;
  B.field_2 = *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)&_min_v->field_1;
  glm::vec<3,_float,_(glm::qualifier)0>::vec
            ((vec<3,_float,_(glm::qualifier)0> *)&C.field_1,H.field_2.z,fStack_34,H.field_0.x);
  glm::vec<3,_float,_(glm::qualifier)0>::vec
            ((vec<3,_float,_(glm::qualifier)0> *)&D.field_1,B.field_1.y,fStack_34,H.field_0.x);
  glm::vec<3,_float,_(glm::qualifier)0>::vec
            ((vec<3,_float,_(glm::qualifier)0> *)&F.field_1,B.field_1.y,fStack_34,fVar1);
  glm::vec<3,_float,_(glm::qualifier)0>::vec
            ((vec<3,_float,_(glm::qualifier)0> *)&G.field_1,H.field_2.z,B.field_2.z,fVar1);
  glm::vec<3,_float,_(glm::qualifier)0>::vec
            ((vec<3,_float,_(glm::qualifier)0> *)&I.field_1,H.field_2.z,B.field_2.z,H.field_0.x);
  glm::vec<3,_float,_(glm::qualifier)0>::vec
            ((vec<3,_float,_(glm::qualifier)0> *)local_90,B.field_1.y,B.field_2.z,fVar1);
  local_91 = 0;
  Mesh::Mesh(__return_storage_ptr__);
  Mesh::setDrawMode(__return_storage_ptr__,LINES);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&F.field_1,
                         (vec<3,_float,_(glm::qualifier)0> *)&H.field_2);
  local_180.field_2 = vVar3.field_2;
  local_180._0_8_ = vVar3._0_8_;
  local_170._0_8_ = local_180._0_8_;
  local_170.field_2 = local_180.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_170);
  local_190.field_2 = vVar3.field_2;
  local_190._0_8_ = vVar3._0_8_;
  local_160._0_8_ = local_190._0_8_;
  local_160.field_2 = local_190.field_2;
  lineToMesh(&local_150,(vec3 *)&H.field_2,&local_160,fVar2);
  Mesh::append(__return_storage_ptr__,&local_150);
  Mesh::~Mesh(&local_150);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&C.field_1,
                         (vec<3,_float,_(glm::qualifier)0> *)&H.field_2);
  local_268.field_2 = vVar3.field_2;
  local_268._0_8_ = vVar3._0_8_;
  local_258._0_8_ = local_268._0_8_;
  local_258.field_2 = local_268.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_258);
  local_278.field_2 = vVar3.field_2;
  local_278._0_8_ = vVar3._0_8_;
  local_248._0_8_ = local_278._0_8_;
  local_248.field_2 = local_278.field_2;
  lineToMesh(&local_238,(vec3 *)&H.field_2,&local_248,fVar2);
  Mesh::append(__return_storage_ptr__,&local_238);
  Mesh::~Mesh(&local_238);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&G.field_1,
                         (vec<3,_float,_(glm::qualifier)0> *)&H.field_2);
  local_350.field_2 = vVar3.field_2;
  local_350._0_8_ = vVar3._0_8_;
  local_340._0_8_ = local_350._0_8_;
  local_340.field_2 = local_350.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_340);
  local_360.field_2 = vVar3.field_2;
  local_360._0_8_ = vVar3._0_8_;
  local_330._0_8_ = local_360._0_8_;
  local_330.field_2 = local_360.field_2;
  lineToMesh(&local_320,(vec3 *)&H.field_2,&local_330,fVar2);
  Mesh::append(__return_storage_ptr__,&local_320);
  Mesh::~Mesh(&local_320);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&H.field_2,
                         (vec<3,_float,_(glm::qualifier)0> *)&C.field_1);
  local_438.field_2 = vVar3.field_2;
  local_438._0_8_ = vVar3._0_8_;
  local_428._0_8_ = local_438._0_8_;
  local_428.field_2 = local_438.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_428);
  local_448.field_2 = vVar3.field_2;
  local_448._0_8_ = vVar3._0_8_;
  local_418._0_8_ = local_448._0_8_;
  local_418.field_2 = local_448.field_2;
  lineToMesh(&local_408,(vec3 *)&C.field_1,&local_418,fVar2);
  Mesh::append(__return_storage_ptr__,&local_408);
  Mesh::~Mesh(&local_408);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&D.field_1,
                         (vec<3,_float,_(glm::qualifier)0> *)&C.field_1);
  local_520.field_2 = vVar3.field_2;
  local_520._0_8_ = vVar3._0_8_;
  local_510._0_8_ = local_520._0_8_;
  local_510.field_2 = local_520.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_510);
  local_530.field_2 = vVar3.field_2;
  local_530._0_8_ = vVar3._0_8_;
  local_500._0_8_ = local_530._0_8_;
  local_500.field_2 = local_530.field_2;
  lineToMesh(&local_4f0,(vec3 *)&C.field_1,&local_500,fVar2);
  Mesh::append(__return_storage_ptr__,&local_4f0);
  Mesh::~Mesh(&local_4f0);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&I.field_1,
                         (vec<3,_float,_(glm::qualifier)0> *)&C.field_1);
  local_608.field_2 = vVar3.field_2;
  local_608._0_8_ = vVar3._0_8_;
  local_5f8._0_8_ = local_608._0_8_;
  local_5f8.field_2 = local_608.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_5f8);
  local_618.field_2 = vVar3.field_2;
  local_618._0_8_ = vVar3._0_8_;
  local_5e8._0_8_ = local_618._0_8_;
  local_5e8.field_2 = local_618.field_2;
  lineToMesh(&local_5d8,(vec3 *)&C.field_1,&local_5e8,fVar2);
  Mesh::append(__return_storage_ptr__,&local_5d8);
  Mesh::~Mesh(&local_5d8);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&F.field_1,
                         (vec<3,_float,_(glm::qualifier)0> *)&D.field_1);
  local_6f0.field_2 = vVar3.field_2;
  local_6f0._0_8_ = vVar3._0_8_;
  local_6e0._0_8_ = local_6f0._0_8_;
  local_6e0.field_2 = local_6f0.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_6e0);
  local_700.field_2 = vVar3.field_2;
  local_700._0_8_ = vVar3._0_8_;
  local_6d0._0_8_ = local_700._0_8_;
  local_6d0.field_2 = local_700.field_2;
  lineToMesh(&local_6c0,(vec3 *)&D.field_1,&local_6d0,fVar2);
  Mesh::append(__return_storage_ptr__,&local_6c0);
  Mesh::~Mesh(&local_6c0);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&C.field_1,
                         (vec<3,_float,_(glm::qualifier)0> *)&D.field_1);
  local_7d8.field_2 = vVar3.field_2;
  local_7d8._0_8_ = vVar3._0_8_;
  local_7c8._0_8_ = local_7d8._0_8_;
  local_7c8.field_2 = local_7d8.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_7c8);
  local_7e8.field_2 = vVar3.field_2;
  local_7e8._0_8_ = vVar3._0_8_;
  local_7b8._0_8_ = local_7e8._0_8_;
  local_7b8.field_2 = local_7e8.field_2;
  lineToMesh(&local_7a8,(vec3 *)&D.field_1,&local_7b8,fVar2);
  Mesh::append(__return_storage_ptr__,&local_7a8);
  Mesh::~Mesh(&local_7a8);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&B.field_1,
                         (vec<3,_float,_(glm::qualifier)0> *)&D.field_1);
  local_8c0.field_2 = vVar3.field_2;
  local_8c0._0_8_ = vVar3._0_8_;
  local_8b0._0_8_ = local_8c0._0_8_;
  local_8b0.field_2 = local_8c0.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_8b0);
  local_8d0.field_2 = vVar3.field_2;
  local_8d0._0_8_ = vVar3._0_8_;
  local_8a0._0_8_ = local_8d0._0_8_;
  local_8a0.field_2 = local_8d0.field_2;
  lineToMesh(&local_890,(vec3 *)&D.field_1,&local_8a0,fVar2);
  Mesh::append(__return_storage_ptr__,&local_890);
  Mesh::~Mesh(&local_890);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&H.field_2,
                         (vec<3,_float,_(glm::qualifier)0> *)&F.field_1);
  local_9a8.field_2 = vVar3.field_2;
  local_9a8._0_8_ = vVar3._0_8_;
  local_998._0_8_ = local_9a8._0_8_;
  local_998.field_2 = local_9a8.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_998);
  local_9b8.field_2 = vVar3.field_2;
  local_9b8._0_8_ = vVar3._0_8_;
  local_988._0_8_ = local_9b8._0_8_;
  local_988.field_2 = local_9b8.field_2;
  lineToMesh(&local_978,(vec3 *)&F.field_1,&local_988,fVar2);
  Mesh::append(__return_storage_ptr__,&local_978);
  Mesh::~Mesh(&local_978);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&D.field_1,
                         (vec<3,_float,_(glm::qualifier)0> *)&F.field_1);
  local_a90.field_2 = vVar3.field_2;
  local_a90._0_8_ = vVar3._0_8_;
  local_a80._0_8_ = local_a90._0_8_;
  local_a80.field_2 = local_a90.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_a80);
  local_aa0.field_2 = vVar3.field_2;
  local_aa0._0_8_ = vVar3._0_8_;
  local_a70._0_8_ = local_aa0._0_8_;
  local_a70.field_2 = local_aa0.field_2;
  lineToMesh(&local_a60,(vec3 *)&F.field_1,&local_a70,fVar2);
  Mesh::append(__return_storage_ptr__,&local_a60);
  Mesh::~Mesh(&local_a60);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)local_90,
                         (vec<3,_float,_(glm::qualifier)0> *)&F.field_1);
  local_b78.field_2 = vVar3.field_2;
  local_b78._0_8_ = vVar3._0_8_;
  local_b68._0_8_ = local_b78._0_8_;
  local_b68.field_2 = local_b78.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_b68);
  local_b88.field_2 = vVar3.field_2;
  local_b88._0_8_ = vVar3._0_8_;
  local_b58._0_8_ = local_b88._0_8_;
  local_b58.field_2 = local_b88.field_2;
  lineToMesh(&local_b48,(vec3 *)&F.field_1,&local_b58,fVar2);
  Mesh::append(__return_storage_ptr__,&local_b48);
  Mesh::~Mesh(&local_b48);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&I.field_1,
                         (vec<3,_float,_(glm::qualifier)0> *)&G.field_1);
  local_c60.field_2 = vVar3.field_2;
  local_c60._0_8_ = vVar3._0_8_;
  local_c50._0_8_ = local_c60._0_8_;
  local_c50.field_2 = local_c60.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_c50);
  local_c70.field_2 = vVar3.field_2;
  local_c70._0_8_ = vVar3._0_8_;
  local_c40._0_8_ = local_c70._0_8_;
  local_c40.field_2 = local_c70.field_2;
  lineToMesh(&local_c30,(vec3 *)&G.field_1,&local_c40,fVar2);
  Mesh::append(__return_storage_ptr__,&local_c30);
  Mesh::~Mesh(&local_c30);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&H.field_2,
                         (vec<3,_float,_(glm::qualifier)0> *)&G.field_1);
  local_d48.field_2 = vVar3.field_2;
  local_d48._0_8_ = vVar3._0_8_;
  local_d38._0_8_ = local_d48._0_8_;
  local_d38.field_2 = local_d48.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_d38);
  local_d58.field_2 = vVar3.field_2;
  local_d58._0_8_ = vVar3._0_8_;
  local_d28._0_8_ = local_d58._0_8_;
  local_d28.field_2 = local_d58.field_2;
  lineToMesh(&local_d18,(vec3 *)&G.field_1,&local_d28,fVar2);
  Mesh::append(__return_storage_ptr__,&local_d18);
  Mesh::~Mesh(&local_d18);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)local_90,
                         (vec<3,_float,_(glm::qualifier)0> *)&G.field_1);
  local_e30.field_2 = vVar3.field_2;
  local_e30._0_8_ = vVar3._0_8_;
  local_e20._0_8_ = local_e30._0_8_;
  local_e20.field_2 = local_e30.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_e20);
  local_e40.field_2 = vVar3.field_2;
  local_e40._0_8_ = vVar3._0_8_;
  local_e10._0_8_ = local_e40._0_8_;
  local_e10.field_2 = local_e40.field_2;
  lineToMesh(&local_e00,(vec3 *)&G.field_1,&local_e10,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e00);
  Mesh::~Mesh(&local_e00);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&B.field_1,
                         (vec<3,_float,_(glm::qualifier)0> *)&I.field_1);
  local_f18.field_2 = vVar3.field_2;
  local_f18._0_8_ = vVar3._0_8_;
  local_f08._0_8_ = local_f18._0_8_;
  local_f08.field_2 = local_f18.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_f08);
  local_f28.field_2 = vVar3.field_2;
  local_f28._0_8_ = vVar3._0_8_;
  local_ef8._0_8_ = local_f28._0_8_;
  local_ef8.field_2 = local_f28.field_2;
  lineToMesh(&local_ee8,(vec3 *)&I.field_1,&local_ef8,fVar2);
  Mesh::append(__return_storage_ptr__,&local_ee8);
  Mesh::~Mesh(&local_ee8);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&G.field_1,
                         (vec<3,_float,_(glm::qualifier)0> *)&I.field_1);
  local_1000.field_2 = vVar3.field_2;
  local_1000._0_8_ = vVar3._0_8_;
  local_ff0._0_8_ = local_1000._0_8_;
  local_ff0.field_2 = local_1000.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_ff0);
  local_1010.field_2 = vVar3.field_2;
  local_1010._0_8_ = vVar3._0_8_;
  local_fe0._0_8_ = local_1010._0_8_;
  local_fe0.field_2 = local_1010.field_2;
  lineToMesh(&local_fd0,(vec3 *)&I.field_1,&local_fe0,fVar2);
  Mesh::append(__return_storage_ptr__,&local_fd0);
  Mesh::~Mesh(&local_fd0);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&C.field_1,
                         (vec<3,_float,_(glm::qualifier)0> *)&I.field_1);
  local_10e8.field_2 = vVar3.field_2;
  local_10e8._0_8_ = vVar3._0_8_;
  local_10d8._0_8_ = local_10e8._0_8_;
  local_10d8.field_2 = local_10e8.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_10d8);
  local_10f8.field_2 = vVar3.field_2;
  local_10f8._0_8_ = vVar3._0_8_;
  local_10c8._0_8_ = local_10f8._0_8_;
  local_10c8.field_2 = local_10f8.field_2;
  lineToMesh(&local_10b8,(vec3 *)&I.field_1,&local_10c8,fVar2);
  Mesh::append(__return_storage_ptr__,&local_10b8);
  Mesh::~Mesh(&local_10b8);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)local_90,
                         (vec<3,_float,_(glm::qualifier)0> *)&B.field_1);
  local_11d0.field_2 = vVar3.field_2;
  local_11d0._0_8_ = vVar3._0_8_;
  local_11c0._0_8_ = local_11d0._0_8_;
  local_11c0.field_2 = local_11d0.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_11c0);
  local_11e0.field_2 = vVar3.field_2;
  local_11e0._0_8_ = vVar3._0_8_;
  local_11b0._0_8_ = local_11e0._0_8_;
  local_11b0.field_2 = local_11e0.field_2;
  lineToMesh(&local_11a0,(vec3 *)&B.field_1,&local_11b0,fVar2);
  Mesh::append(__return_storage_ptr__,&local_11a0);
  Mesh::~Mesh(&local_11a0);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&I.field_1,
                         (vec<3,_float,_(glm::qualifier)0> *)&B.field_1);
  local_12b8.field_2 = vVar3.field_2;
  local_12b8._0_8_ = vVar3._0_8_;
  local_12a8._0_8_ = local_12b8._0_8_;
  local_12a8.field_2 = local_12b8.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_12a8);
  local_12c8.field_2 = vVar3.field_2;
  local_12c8._0_8_ = vVar3._0_8_;
  local_1298._0_8_ = local_12c8._0_8_;
  local_1298.field_2 = local_12c8.field_2;
  lineToMesh(&local_1288,(vec3 *)&B.field_1,&local_1298,fVar2);
  Mesh::append(__return_storage_ptr__,&local_1288);
  Mesh::~Mesh(&local_1288);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&D.field_1,
                         (vec<3,_float,_(glm::qualifier)0> *)&B.field_1);
  local_13a0.field_2 = vVar3.field_2;
  local_13a0._0_8_ = vVar3._0_8_;
  local_1390._0_8_ = local_13a0._0_8_;
  local_1390.field_2 = local_13a0.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_1390);
  local_13b0.field_2 = vVar3.field_2;
  local_13b0._0_8_ = vVar3._0_8_;
  local_1380._0_8_ = local_13b0._0_8_;
  local_1380.field_2 = local_13b0.field_2;
  lineToMesh(&local_1370,(vec3 *)&B.field_1,&local_1380,fVar2);
  Mesh::append(__return_storage_ptr__,&local_1370);
  Mesh::~Mesh(&local_1370);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&G.field_1,
                         (vec<3,_float,_(glm::qualifier)0> *)local_90);
  local_1488.field_2 = vVar3.field_2;
  local_1488._0_8_ = vVar3._0_8_;
  local_1478._0_8_ = local_1488._0_8_;
  local_1478.field_2 = local_1488.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_1478);
  local_1498.field_2 = vVar3.field_2;
  local_1498._0_8_ = vVar3._0_8_;
  local_1468._0_8_ = local_1498._0_8_;
  local_1468.field_2 = local_1498.field_2;
  lineToMesh(&local_1458,(vec3 *)local_90,&local_1468,fVar2);
  Mesh::append(__return_storage_ptr__,&local_1458);
  Mesh::~Mesh(&local_1458);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&B.field_1,
                         (vec<3,_float,_(glm::qualifier)0> *)local_90);
  local_1570.field_2 = vVar3.field_2;
  local_1570._0_8_ = vVar3._0_8_;
  local_1560._0_8_ = local_1570._0_8_;
  local_1560.field_2 = local_1570.field_2;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_1560);
  local_1580.field_2 = vVar3.field_2;
  local_1580._0_8_ = vVar3._0_8_;
  local_1550._0_8_ = local_1580._0_8_;
  local_1550.field_2 = local_1580.field_2;
  lineToMesh(&local_1540,(vec3 *)local_90,&local_1550,fVar2);
  Mesh::append(__return_storage_ptr__,&local_1540);
  Mesh::~Mesh(&local_1540);
  vVar3 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&F.field_1,
                         (vec<3,_float,_(glm::qualifier)0> *)local_90);
  local_1648.field_2 = vVar3.field_2;
  local_1648._0_8_ = vVar3._0_8_;
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_1648);
  local_1638.field_2 = vVar3.field_2;
  local_1638._0_8_ = vVar3._0_8_;
  lineToMesh(&local_1628,(vec3 *)local_90,&local_1638,fVar2);
  Mesh::append(__return_storage_ptr__,&local_1628);
  Mesh::~Mesh(&local_1628);
  return __return_storage_ptr__;
}

Assistant:

Mesh cubeCornersMesh(const glm::vec3 &_min_v, const glm::vec3 &_max_v, float _size) {
    float size = glm::min(glm::length(_min_v), glm::length(_max_v)) * _size *  0.5;

    //    D ---- A
    // C ---- B  |
    // |  |   |  |
    // |  I --|- F
    // H .... G

    glm::vec3 A = _max_v;
    glm::vec3 H = _min_v;

    glm::vec3 B = glm::vec3(A.x, A.y, H.z);
    glm::vec3 C = glm::vec3(H.x, A.y, H.z);
    glm::vec3 D = glm::vec3(H.x, A.y, A.z);

    glm::vec3 F = glm::vec3(A.x, H.y, A.z);
    glm::vec3 G = glm::vec3(A.x, H.y, H.z);
    glm::vec3 I = glm::vec3(H.x, H.y, A.z);

    Mesh mesh;
    mesh.setDrawMode(LINES);
    mesh.append( lineToMesh(A, normalize(D-A), size) );
    mesh.append( lineToMesh(A, normalize(B-A), size) );
    mesh.append( lineToMesh(A, normalize(F-A), size) );

    mesh.append( lineToMesh(B, normalize(A-B), size) );
    mesh.append( lineToMesh(B, normalize(C-B), size) );
    mesh.append( lineToMesh(B, normalize(G-B), size) );

    mesh.append( lineToMesh(C, normalize(D-C), size) );
    mesh.append( lineToMesh(C, normalize(B-C), size) );
    mesh.append( lineToMesh(C, normalize(H-C), size) );
    
    mesh.append( lineToMesh(D, normalize(A-D), size) );
    mesh.append( lineToMesh(D, normalize(C-D), size) );
    mesh.append( lineToMesh(D, normalize(I-D), size) );

    mesh.append( lineToMesh(F, normalize(G-F), size) );
    mesh.append( lineToMesh(F, normalize(A-F), size) );
    mesh.append( lineToMesh(F, normalize(I-F), size) );

    mesh.append( lineToMesh(G, normalize(H-G), size) );
    mesh.append( lineToMesh(G, normalize(F-G), size) );
    mesh.append( lineToMesh(G, normalize(B-G), size) );

    mesh.append( lineToMesh(H, normalize(I-H), size) );
    mesh.append( lineToMesh(H, normalize(G-H), size) );
    mesh.append( lineToMesh(H, normalize(C-H), size) );

    mesh.append( lineToMesh(I, normalize(F-I), size) );
    mesh.append( lineToMesh(I, normalize(H-I), size) );
    mesh.append( lineToMesh(I, normalize(D-I), size) );

    return mesh;
}